

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

lumeview * __thiscall lumeview::LoadStringFromFile_abi_cxx11_(lumeview *this,char *filename)

{
  byte bVar1;
  ostream *poVar2;
  LumeviewError *this_00;
  ulong uVar3;
  long lVar4;
  fpos<__mbstate_t> local_430;
  allocator local_419;
  string local_418 [8];
  string buffer;
  fpos local_3f8 [16];
  ulong local_3e8;
  size_t size;
  string local_3d8 [32];
  stringstream local_3b8 [8];
  stringstream ss;
  ostream local_3a8 [392];
  long local_220;
  ifstream t;
  char *filename_local;
  
  std::ifstream::ifstream(&local_220,filename,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::seekg((long)&local_220,_S_beg);
    local_3f8 = (fpos  [16])std::istream::tellg();
    uVar3 = std::fpos::operator_cast_to_long(local_3f8);
    local_3e8 = uVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,uVar3,' ',&local_419);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    std::fpos<__mbstate_t>::fpos(&local_430,0);
    std::istream::seekg(&local_220,local_430._M_off,local_430._M_state);
    lVar4 = std::__cxx11::string::operator[]((ulong)local_418);
    std::istream::read((char *)&local_220,lVar4);
    std::__cxx11::string::string((string *)this,local_418);
    std::__cxx11::string::~string(local_418);
    std::ifstream::~ifstream(&local_220);
    return this;
  }
  std::__cxx11::stringstream::stringstream(local_3b8);
  poVar2 = std::operator<<(local_3a8,"FILE::LOAD_FROM_STRING");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"Couldn\'t find file ");
  std::operator<<(poVar2,filename);
  size._7_1_ = 1;
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringstream::str();
  LumeviewError::LumeviewError(this_00,local_3d8);
  size._7_1_ = 0;
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

string LoadStringFromFile (const char* filename)
{
	ifstream t(filename);
	COND_THROW (!t, "FILE::LOAD_FROM_STRING" << endl <<
	            "Couldn't find file " << filename);
	t.seekg(0, ios::end);
	size_t size = t.tellg();
	string buffer(size, ' ');
	t.seekg(0);
	t.read(&buffer[0], size);
	return std::move(buffer);
}